

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

void absl::lts_20250127::CheckForMutexCorruption(intptr_t v,char *label)

{
  int iVar1;
  PerThreadSynch *pPVar2;
  SynchWaitParams *pSVar3;
  PerThreadSynch *pPVar4;
  uint uVar5;
  undefined8 extraout_RAX;
  long lVar6;
  pthread_t __target_thread;
  ThreadIdentity *pTVar7;
  uint in_ECX;
  PerThreadSynch *pPVar8;
  PerThreadSynch *extraout_RDX;
  PerThreadSynch *pPVar9;
  PerThreadSynch *extraout_RDX_00;
  PerThreadSynch *pPVar10;
  uint unaff_EBP;
  synchronization_internal *this;
  PerThreadSynch *unaff_R12;
  ThreadIdentity *y;
  bool bVar11;
  double dVar12;
  undefined8 uStack_40;
  
  if ((((uint)v * 8 ^ 0x20) & (uint)v & 0x28) == 0) {
    return;
  }
  CheckForMutexCorruption();
  uStack_40._0_4_ = (int)extraout_RAX;
  y = (ThreadIdentity *)((SynchWaitParams *)label)->cv_word;
  if (y != (ThreadIdentity *)0x0) {
    ((SynchWaitParams *)label)->cv_word = (atomic<long> *)0x0;
    this = (synchronization_internal *)0x0;
    pPVar9 = extraout_RDX;
    uStack_40 = extraout_RAX;
    do {
      pPVar2 = (y->per_thread_synch).next;
      if (((ulong)pPVar2 & 1) == 0) {
        pPVar9 = (PerThreadSynch *)((ulong)pPVar2 | 1);
        LOCK();
        bVar11 = pPVar2 == (y->per_thread_synch).next;
        if (bVar11) {
          (y->per_thread_synch).next = pPVar9;
        }
        UNLOCK();
        if (bVar11) goto LAB_002a3351;
      }
      uVar5 = synchronization_internal::MutexDelay(this,1,(int)pPVar9);
      this = (synchronization_internal *)(ulong)uVar5;
      pPVar9 = extraout_RDX_00;
    } while( true );
  }
  y = (ThreadIdentity *)((SynchWaitParams *)label)->thread;
  pSVar3 = (y->per_thread_synch).waitp;
  unaff_R12 = extraout_RDX;
  if ((pSVar3 != (SynchWaitParams *)label && pSVar3 != (SynchWaitParams *)0x0) &&
     ((y->per_thread_synch).suppress_fatal_errors == false)) goto LAB_002a3601;
  (y->per_thread_synch).waitp = (SynchWaitParams *)label;
  (y->per_thread_synch).skip = (PerThreadSynch *)0x0;
  (y->per_thread_synch).may_skip = true;
  (y->per_thread_synch).wake = false;
  (y->per_thread_synch).cond_waiter = (bool)((byte)(in_ECX >> 1) & 1);
  if ((in_ECX & 4) == 0) {
    pTVar7 = base_internal::CurrentThreadIdentityIfPresent();
    if (pTVar7 == (ThreadIdentity *)0x0) goto LAB_002a3606;
    goto LAB_002a33ef;
  }
LAB_002a3481:
  if ((PerThreadSynch *)v == (PerThreadSynch *)0x0) {
    (y->per_thread_synch).next = &y->per_thread_synch;
    (y->per_thread_synch).readers = (intptr_t)unaff_R12;
    (y->per_thread_synch).maybe_unlocking = false;
    goto LAB_002a35d4;
  }
  iVar1 = (y->per_thread_synch).priority;
  if (((PerThreadSynch *)v)->priority < iVar1) {
    pPVar9 = (PerThreadSynch *)v;
    if (((PerThreadSynch *)v)->maybe_unlocking == false) {
      do {
        pPVar10 = pPVar9;
        pPVar8 = pPVar10->next;
        pPVar2 = pPVar8->skip;
        pPVar9 = pPVar8;
        if (pPVar2 != (PerThreadSynch *)0x0) {
          pPVar4 = pPVar8;
          pPVar9 = pPVar2;
          for (pPVar2 = pPVar2->skip; pPVar2 != (PerThreadSynch *)0x0; pPVar2 = pPVar2->skip) {
            pPVar4->skip = pPVar2;
            pPVar4 = pPVar9;
            pPVar9 = pPVar2;
          }
          pPVar8->skip = pPVar9;
        }
      } while (iVar1 <= pPVar9->priority);
    }
    else {
      if ((((SynchWaitParams *)label)->how != (MuHow)kExclusiveS) ||
         (((SynchWaitParams *)label)->cond != (Condition *)0x0)) goto LAB_002a34b4;
      pPVar8 = ((PerThreadSynch *)v)->next;
      pPVar10 = (PerThreadSynch *)v;
    }
    (y->per_thread_synch).next = pPVar8;
    pPVar10->next = &y->per_thread_synch;
    if ((pPVar10->skip != (PerThreadSynch *)0x0) &&
       (bVar11 = MuEquivalentWaiter(pPVar10,&y->per_thread_synch), !bVar11)) {
      Enqueue();
LAB_002a3615:
      __assert_fail("s == Synch_GetPerThread()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x3b1,
                    "PerThreadSynch *absl::Enqueue(PerThreadSynch *, SynchWaitParams *, intptr_t, int)"
                   );
    }
    if (((pPVar10 != (PerThreadSynch *)v) && (pPVar10->may_skip == true)) &&
       (bVar11 = MuEquivalentWaiter(pPVar10,&y->per_thread_synch), bVar11)) {
      pPVar10->skip = &y->per_thread_synch;
    }
  }
  else {
LAB_002a34b4:
    pPVar9 = ((PerThreadSynch *)v)->next;
    if ((((in_ECX & 1) == 0) || (iVar1 < pPVar9->priority)) ||
       ((((PerThreadSynch *)v)->maybe_unlocking == true &&
        ((((SynchWaitParams *)label)->how != (MuHow)kExclusiveS ||
         (((SynchWaitParams *)label)->cond != (Condition *)0x0)))))) {
      (y->per_thread_synch).next = pPVar9;
      ((PerThreadSynch *)v)->next = &y->per_thread_synch;
      (y->per_thread_synch).readers = ((PerThreadSynch *)v)->readers;
      (y->per_thread_synch).maybe_unlocking = ((PerThreadSynch *)v)->maybe_unlocking;
      if ((((PerThreadSynch *)v)->may_skip == true) &&
         (bVar11 = MuEquivalentWaiter((PerThreadSynch *)v,&y->per_thread_synch), bVar11)) {
        ((PerThreadSynch *)v)->skip = &y->per_thread_synch;
      }
      goto LAB_002a35d4;
    }
    (y->per_thread_synch).next = pPVar9;
    ((PerThreadSynch *)v)->next = &y->per_thread_synch;
  }
  pPVar9 = (y->per_thread_synch).next;
  bVar11 = MuEquivalentWaiter(&y->per_thread_synch,pPVar9);
  if (bVar11) {
    (y->per_thread_synch).skip = pPVar9;
  }
LAB_002a35d4:
  (y->per_thread_synch).state._M_i = kQueued;
  return;
LAB_002a3351:
  pPVar9 = ((SynchWaitParams *)label)->thread;
  if (pPVar9->waitp == (SynchWaitParams *)0x0) {
    pPVar9->waitp = (SynchWaitParams *)label;
    pPVar10 = (PerThreadSynch *)((ulong)pPVar2 & 0xfffffffffffffffc);
    pPVar8 = pPVar9;
    if (pPVar10 != (PerThreadSynch *)0x0) {
      pPVar9->next = pPVar10->next;
      pPVar8 = pPVar10;
    }
    pPVar8->next = pPVar9;
    (pPVar9->state)._M_i = kQueued;
    (y->per_thread_synch).next =
         (PerThreadSynch *)((ulong)((uint)pPVar2 & 2) | (ulong)((SynchWaitParams *)label)->thread);
    return;
  }
  Enqueue();
  in_ECX = unaff_EBP;
LAB_002a3601:
  Enqueue();
LAB_002a3606:
  pTVar7 = synchronization_internal::CreateThreadIdentity();
LAB_002a33ef:
  if (y != pTVar7) goto LAB_002a3615;
  if (base_internal::CycleClock::cycle_clock_source_ == (code *)0x0) {
    lVar6 = rdtsc();
  }
  else {
    lVar6 = (*base_internal::CycleClock::cycle_clock_source_)();
  }
  if ((y->per_thread_synch).next_priority_read_cycles < lVar6 >> 2) {
    __target_thread = pthread_self();
    uVar5 = pthread_getschedparam
                      (__target_thread,(int *)((long)&uStack_40 + 4),(sched_param *)&uStack_40);
    if (uVar5 == 0) {
      (y->per_thread_synch).priority = uStack_40._0_4_;
      dVar12 = base_internal::UnscaledCycleClock::Frequency();
      (y->per_thread_synch).next_priority_read_cycles = (lVar6 >> 2) + (long)(dVar12 * 0.25);
    }
    else {
      raw_log_internal::RawLog
                (kError,"mutex.cc",0x3bb,"pthread_getschedparam failed: %d",(ulong)uVar5);
    }
  }
  goto LAB_002a3481;
}

Assistant:

static void CheckForMutexCorruption(intptr_t v, const char* label) {
  // Test for either of two situations that should not occur in v:
  //   kMuWriter and kMuReader
  //   kMuWrWait and !kMuWait
  const uintptr_t w = static_cast<uintptr_t>(v ^ kMuWait);
  // By flipping that bit, we can now test for:
  //   kMuWriter and kMuReader in w
  //   kMuWrWait and kMuWait in w
  // We've chosen these two pairs of values to be so that they will overlap,
  // respectively, when the word is left shifted by three.  This allows us to
  // save a branch in the common (correct) case of them not being coincident.
  static_assert(kMuReader << 3 == kMuWriter, "must match");
  static_assert(kMuWait << 3 == kMuWrWait, "must match");
  if (ABSL_PREDICT_TRUE((w & (w << 3) & (kMuWriter | kMuWrWait)) == 0)) return;
  RAW_CHECK_FMT((v & (kMuWriter | kMuReader)) != (kMuWriter | kMuReader),
                "%s: Mutex corrupt: both reader and writer lock held: %p",
                label, reinterpret_cast<void*>(v));
  RAW_CHECK_FMT((v & (kMuWait | kMuWrWait)) != kMuWrWait,
                "%s: Mutex corrupt: waiting writer with no waiters: %p", label,
                reinterpret_cast<void*>(v));
  assert(false);
}